

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockSettingsHandler_ClearAll(ImGuiContext_conflict1 *ctx,ImGuiSettingsHandler *param_2)

{
  ImVector<ImGuiDockNodeSettings>::clear(&(ctx->DockContext).NodesSettings);
  DockContextClearNodes(ctx,0,true);
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiDockContext* dc  = &ctx->DockContext;
    dc->NodesSettings.clear();
    DockContextClearNodes(ctx, 0, true);
}